

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_patchclose(FuncState *fs,int list,int level)

{
  ushort uVar1;
  Instruction *pIVar2;
  uint uVar3;
  long lVar4;
  
  if (list != -1) {
    do {
      pIVar2 = fs->f->code;
      lVar4 = (long)list;
      uVar3 = pIVar2[lVar4];
      if (((char)uVar3 != '\x1e') || (uVar3 = uVar3 >> 8 & 0x7f, (int)uVar3 <= level && uVar3 != 0))
      {
        __assert_fail("((OpCode)(((fs->f->code[list])&0xff))) == OP_JMP && (((int)(((fs->f->code[list])>>8)&0x7f)) == 0 || ((int)(((fs->f->code[list])>>8)&0x7f)) >= level)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x125,"void luaK_patchclose(FuncState *, int, int)");
      }
      *(byte *)((long)pIVar2 + lVar4 * 4 + 1) = (byte)(level + 1U) & 0x7f;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)fs->f->code[lVar4],(ulong)(level + 1U));
      }
      uVar1 = *(ushort *)((long)fs->f->code + lVar4 * 4 + 2);
      list = list + -0x7fff + (uint)uVar1;
      if (uVar1 == 0x7fff) {
        list = -1;
      }
    } while (list != -1);
  }
  return;
}

Assistant:

void luaK_patchclose (FuncState *fs, int list, int level) {
  level++;  /* argument is +1 to reserve 0 as non-op */
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                (GETARG_A(fs->f->code[list]) == 0 ||
                 GETARG_A(fs->f->code[list]) >= level));
    SETARG_A(fs->f->code[list], level);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", fs->f->code[list], level));
  }
}